

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector3d.h
# Opt level: O0

bool __thiscall irr::core::vector3d<float>::equals(vector3d<float> *this,vector3d<float> *other)

{
  bool bVar1;
  long in_RSI;
  long in_RDI;
  float in_stack_ffffffffffffffcc;
  float tolerance;
  float in_stack_ffffffffffffffd0;
  float b;
  float in_stack_ffffffffffffffd4;
  float a;
  undefined1 local_11;
  
  roundingError<float>();
  bVar1 = equals<float,_true>(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0,
                              in_stack_ffffffffffffffcc);
  local_11 = false;
  if (bVar1) {
    a = *(float *)(in_RDI + 4);
    b = *(float *)(in_RSI + 4);
    roundingError<float>();
    bVar1 = equals<float,_true>(a,b,in_stack_ffffffffffffffcc);
    local_11 = false;
    if (bVar1) {
      tolerance = *(float *)(in_RDI + 8);
      roundingError<float>();
      local_11 = equals<float,_true>(a,b,tolerance);
    }
  }
  return local_11;
}

Assistant:

bool equals(const vector3d<T> &other) const
	{
		return core::equals(X, other.X) && core::equals(Y, other.Y) && core::equals(Z, other.Z);
	}